

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_read_obu_header(AV1Context *ctx,BitReadCtx_t *gb,AV1RawOBUHeader *current)

{
  RK_S32 RVar1;
  RK_U8 local_4c [4];
  RK_U8 local_48 [4];
  RK_U32 value_7;
  RK_U32 value_6;
  RK_U32 value_5;
  RK_U32 value_4;
  RK_U32 value_3;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  RK_S32 err;
  AV1RawOBUHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  _value = current;
  current_local = (AV1RawOBUHeader *)gb;
  gb_local = &ctx->gb;
  value_1 = mpp_av1_read_unsigned(gb,1,"obu_forbidden_bit",&value_2,0,0);
  ctx_local._4_4_ = value_1;
  if (-1 < (int)value_1) {
    _value->obu_forbidden_bit = (RK_U8)value_2;
    value_1 = mpp_av1_read_unsigned((BitReadCtx_t *)current_local,4,"obu_type",&value_3,0,0xf);
    ctx_local._4_4_ = value_1;
    if (-1 < (int)value_1) {
      _value->obu_type = (RK_U8)value_3;
      value_1 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,1,"obu_extension_flag",&value_4,0,1);
      ctx_local._4_4_ = value_1;
      if (-1 < (int)value_1) {
        _value->obu_extension_flag = (RK_U8)value_4;
        value_1 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,1,"obu_has_size_field",&value_5,0,1);
        ctx_local._4_4_ = value_1;
        if (-1 < (int)value_1) {
          _value->obu_has_size_field = (RK_U8)value_5;
          value_1 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,1,"obu_reserved_1bit",&value_6,0,0);
          ctx_local._4_4_ = value_1;
          if (-1 < (int)value_1) {
            _value->obu_reserved_1bit = (RK_U8)value_6;
            if (_value->obu_extension_flag == '\0') {
              _value->temporal_id = '\0';
              _value->spatial_id = '\0';
            }
            else {
              value_1 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)current_local,3,"temporal_id",&value_7,0,7);
              if ((int)value_1 < 0) {
                return value_1;
              }
              _value->temporal_id = (RK_U8)value_7;
              value_1 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)current_local,2,"spatial_id",(RK_U32 *)local_48,0
                                   ,3);
              if ((int)value_1 < 0) {
                return value_1;
              }
              _value->spatial_id = local_48[0];
              RVar1 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)current_local,3,"extension_header_reserved_3bits",
                                 (RK_U32 *)local_4c,0,0);
              if (RVar1 < 0) {
                return RVar1;
              }
              _value->extension_header_reserved_3bits = local_4c[0];
            }
            *(uint *)&gb_local[0x50].curr_byte_ = (uint)_value->temporal_id;
            *(uint *)((long)&gb_local[0x50].curr_byte_ + 4) = (uint)_value->spatial_id;
            ctx_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32 mpp_av1_read_obu_header(AV1Context *ctx, BitReadCtx_t *gb,
                                      AV1RawOBUHeader *current)
{
    RK_S32 err;

    fc(1, obu_forbidden_bit, 0, 0);

    fc(4, obu_type, 0, AV1_OBU_PADDING);
    flag(obu_extension_flag);
    flag(obu_has_size_field);

    fc(1, obu_reserved_1bit, 0, 0);

    if (current->obu_extension_flag) {
        fb(3, temporal_id);
        fb(2, spatial_id);
        fc(3, extension_header_reserved_3bits, 0, 0);
    } else {
        infer(temporal_id, 0);
        infer(spatial_id, 0);
    }

    ctx->temporal_id = current->temporal_id;
    ctx->spatial_id  = current->spatial_id;

    return 0;
}